

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O2

gdImagePtr gdImageCreate(int sx,int sy)

{
  int iVar1;
  gdImagePtr ptr;
  uchar **ppuVar2;
  uchar *puVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  iVar1 = overflow2(sx,sy);
  if ((((iVar1 == 0) && (iVar1 = overflow2(8,sy), iVar1 == 0)) &&
      (iVar1 = overflow2(1,sx), iVar1 == 0)) &&
     (ptr = (gdImagePtr)gdCalloc(1,0x1ca8), ptr != (gdImagePtr)0x0)) {
    ppuVar2 = (uchar **)gdMalloc((long)sy << 3);
    ptr->pixels = ppuVar2;
    if (ppuVar2 != (uchar **)0x0) {
      ptr->polyInts = (int *)0x0;
      ptr->polyAllocated = 0;
      ptr->style = (int *)0x0;
      uVar6 = 0;
      uVar5 = 0;
      if (0 < sy) {
        uVar5 = (ulong)(uint)sy;
      }
      ptr->brush = (gdImageStruct *)0x0;
      ptr->tile = (gdImageStruct *)0x0;
      while( true ) {
        if (uVar5 == uVar6) {
          ptr->sx = sx;
          ptr->sy = sy;
          ptr->colorsTotal = 0;
          ptr->transparent = -1;
          ptr->interlace = 0;
          ptr->thick = 1;
          ptr->AA = 0;
          for (lVar4 = 0x305; lVar4 != 0x405; lVar4 = lVar4 + 1) {
            ptr->red[lVar4 + -5] = 1;
          }
          ptr->trueColor = 0;
          ptr->tpixels = (int **)0x0;
          ptr->cx1 = 0;
          ptr->cy1 = 0;
          ptr->cx2 = sx + -1;
          ptr->cy2 = sy + -1;
          ptr->res_x = 0x60;
          ptr->res_y = 0x60;
          ptr->interpolation = (interpolation_method)0x0;
          ptr->interpolation_id = GD_BILINEAR_FIXED;
          return ptr;
        }
        puVar3 = (uchar *)gdCalloc((long)sx,1);
        ptr->pixels[uVar6] = puVar3;
        if (ptr->pixels[uVar6] == (uchar *)0x0) break;
        uVar6 = uVar6 + 1;
      }
      for (; 0 < (long)uVar6; uVar6 = uVar6 - 1) {
        gdFree(ptr->pixels[uVar6 - 1]);
      }
      gdFree(ptr->pixels);
    }
    gdFree(ptr);
  }
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreate (int sx, int sy)
{
	int i;
	gdImagePtr im;

	if (overflow2(sx, sy)) {
		return NULL;
	}

	if (overflow2(sizeof (unsigned char *), sy)) {
		return NULL;
	}
	if (overflow2(sizeof (unsigned char), sx)) {
		return NULL;
	}

	im = (gdImage *) gdCalloc(1, sizeof(gdImage));
	if (!im) {
		return NULL;
	}

	/* Row-major ever since gd 1.3 */
	im->pixels = (unsigned char **) gdMalloc (sizeof (unsigned char *) * sy);
	if (!im->pixels) {
		gdFree(im);
		return NULL;
	}

	im->polyInts = 0;
	im->polyAllocated = 0;
	im->brush = 0;
	im->tile = 0;
	im->style = 0;
	for (i = 0; (i < sy); i++) {
		/* Row-major ever since gd 1.3 */
		im->pixels[i] = (unsigned char *) gdCalloc (sx, sizeof (unsigned char));
		if (!im->pixels[i]) {
			for (--i ; i >= 0; i--) {
				gdFree(im->pixels[i]);
			}
			gdFree(im->pixels);
			gdFree(im);
			return NULL;
		}

	}
	im->sx = sx;
	im->sy = sy;
	im->colorsTotal = 0;
	im->transparent = (-1);
	im->interlace = 0;
	im->thick = 1;
	im->AA = 0;
	for (i = 0; (i < gdMaxColors); i++) {
		im->open[i] = 1;
	};
	im->trueColor = 0;
	im->tpixels = 0;
	im->cx1 = 0;
	im->cy1 = 0;
	im->cx2 = im->sx - 1;
	im->cy2 = im->sy - 1;
	im->res_x = GD_RESOLUTION;
	im->res_y = GD_RESOLUTION;
	im->interpolation = NULL;
	im->interpolation_id = GD_BILINEAR_FIXED;
	return im;
}